

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

bool __thiscall wasm::LEB<int,_signed_char>::hasMore(LEB<int,_signed_char> *this,int temp,char byte)

{
  byte local_22;
  byte local_21;
  char byte_local;
  int temp_local;
  LEB<int,_signed_char> *this_local;
  
  if (((temp == 0) || (local_21 = 1, temp == -1)) &&
     ((this->value < 0 || (local_21 = 1, (byte & 0x40U) == 0)))) {
    local_22 = 0;
    if (this->value < 0) {
      local_22 = (byte & 0x40U) != 0 ^ 0xff;
    }
    local_21 = local_22;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool hasMore(T temp, MiniT byte) {
    // for signed, we must ensure the last bit has the right sign, as it will
    // zero extend
    return std::is_signed<T>::value
             ? (temp != 0 && temp != T(-1)) || (value >= 0 && (byte & 64)) ||
                 (value < 0 && !(byte & 64))
             : (temp != 0);
  }